

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O1

void src_SourceOver(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  if (alpha == 0xff) {
    if (0 < length) {
      uVar1 = 0;
      do {
        uVar2 = src[uVar1];
        if (uVar2 < 0xff000000) {
          if (uVar2 != 0) {
            dest[uVar1] = ((dest[uVar1] >> 8 & 0xff00ff) * (~uVar2 >> 0x18) & 0xff00ff00) + uVar2 +
                          ((dest[uVar1] & 0xff00ff) * (~uVar2 >> 0x18) >> 8 & 0xff00ff);
          }
        }
        else {
          dest[uVar1] = uVar2;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  else if (0 < length) {
    uVar1 = 0;
    do {
      uVar2 = (src[uVar1] >> 8 & 0xff00ff) * alpha;
      uVar3 = ~uVar2 >> 0x18;
      dest[uVar1] = ((dest[uVar1] & 0xff00ff) * uVar3 >> 8 & 0xff00ff) +
                    ((dest[uVar1] >> 8 & 0xff00ff) * uVar3 & 0xff00ff00) +
                    ((src[uVar1] & 0xff00ff) * alpha >> 8 & 0xff00ff | uVar2 & 0xff00ff00);
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
    return;
  }
  return;
}

Assistant:

static void src_SourceOver(uint32_t *dest, int length, const uint32_t *src,
                           uint32_t alpha)
{
    uint32_t s, sia;

    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            s = src[i];
            if (s >= 0xff000000)
                dest[i] = s;
            else if (s != 0) {
                sia = vAlpha(~s);
                dest[i] = s + BYTE_MUL(dest[i], sia);
            }
        }
    } else {
        /* source' = source * const_alpha
         * dest = source' + dest ( 1- source'a)
         */
        for (int i = 0; i < length; ++i) {
            s = BYTE_MUL(src[i], alpha);
            sia = vAlpha(~s);
            dest[i] = s + BYTE_MUL(dest[i], sia);
        }
    }
}